

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaVirtualBlock_T::BuildStatsString(VmaVirtualBlock_T *this,bool detailedMap,VmaStringBuilder *sb)

{
  byte in_SIL;
  VmaDetailedStatistics *in_RDI;
  VmaDetailedStatistics stats;
  VmaJsonWriter json;
  VmaVirtualBlock_T *this_00;
  undefined1 in_stack_ffffffffffffff6f;
  VmaJsonWriter *in_stack_ffffffffffffff70;
  VkAllocationCallbacks *in_stack_ffffffffffffff78;
  VmaJsonWriter *in_stack_ffffffffffffff80;
  VmaVirtualBlock_T local_48;
  
  local_48.m_Metadata._7_1_ = in_SIL & 1;
  GetAllocationCallbacks((VmaVirtualBlock_T *)in_RDI);
  this_00 = &local_48;
  VmaJsonWriter::VmaJsonWriter
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (VmaStringBuilder *)in_stack_ffffffffffffff70);
  VmaJsonWriter::BeginObject(in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  CalculateDetailedStatistics(this_00,in_RDI);
  VmaJsonWriter::WriteString((VmaJsonWriter *)this_00,(char *)in_RDI);
  VmaPrintDetailedStatistics((VmaJsonWriter *)this_00,in_RDI);
  if ((local_48.m_Metadata._7_1_ & 1) != 0) {
    VmaJsonWriter::WriteString((VmaJsonWriter *)this_00,(char *)in_RDI);
    VmaJsonWriter::BeginObject(in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
    (**(code **)(*(long *)in_RDI->unusedRangeSizeMax + 0x80))
              ((long *)in_RDI->unusedRangeSizeMax,&local_48);
    VmaJsonWriter::EndObject((VmaJsonWriter *)this_00);
  }
  VmaJsonWriter::EndObject((VmaJsonWriter *)this_00);
  VmaJsonWriter::~VmaJsonWriter((VmaJsonWriter *)0x2f3a34);
  return;
}

Assistant:

void VmaVirtualBlock_T::BuildStatsString(bool detailedMap, VmaStringBuilder& sb) const
{
    VmaJsonWriter json(GetAllocationCallbacks(), sb);
    json.BeginObject();

    VmaDetailedStatistics stats;
    CalculateDetailedStatistics(stats);

    json.WriteString("Stats");
    VmaPrintDetailedStatistics(json, stats);

    if (detailedMap)
    {
        json.WriteString("Details");
        json.BeginObject();
        m_Metadata->PrintDetailedMap(json);
        json.EndObject();
    }

    json.EndObject();
}